

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O0

void latch_quant_tables(j_decompress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  void *__dest;
  long *in_RDI;
  JQUANT_TBL *qtbl;
  jpeg_component_info *compptr;
  int qtblno;
  int ci;
  int local_c;
  
  for (local_c = 0; local_c < (int)in_RDI[0x36]; local_c = local_c + 1) {
    lVar2 = in_RDI[(long)local_c + 0x37];
    if (*(long *)(lVar2 + 0x50) == 0) {
      iVar1 = *(int *)(lVar2 + 0x10);
      if (((iVar1 < 0) || (3 < iVar1)) || (in_RDI[(long)iVar1 + 0x19] == 0)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x34;
        *(int *)(*in_RDI + 0x2c) = iVar1;
        (**(code **)*in_RDI)(in_RDI);
      }
      __dest = (void *)(**(code **)in_RDI[1])(in_RDI,1,0x84);
      memcpy(__dest,(void *)in_RDI[(long)iVar1 + 0x19],0x84);
      *(void **)(lVar2 + 0x50) = __dest;
    }
  }
  return;
}

Assistant:

LOCAL(void)
latch_quant_tables(j_decompress_ptr cinfo)
{
  int ci, qtblno;
  jpeg_component_info *compptr;
  JQUANT_TBL *qtbl;

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* No work if we already saved Q-table for this component */
    if (compptr->quant_table != NULL)
      continue;
    /* Make sure specified quantization table is present */
    qtblno = compptr->quant_tbl_no;
    if (qtblno < 0 || qtblno >= NUM_QUANT_TBLS ||
        cinfo->quant_tbl_ptrs[qtblno] == NULL)
      ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, qtblno);
    /* OK, save away the quantization table */
    qtbl = (JQUANT_TBL *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(JQUANT_TBL));
    MEMCOPY(qtbl, cinfo->quant_tbl_ptrs[qtblno], sizeof(JQUANT_TBL));
    compptr->quant_table = qtbl;
  }
}